

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

TargetType __thiscall
cmExportInstallFileGenerator::GetExportTargetType
          (cmExportInstallFileGenerator *this,cmTargetExport *targetExport)

{
  TargetType local_1c;
  TargetType targetType;
  cmTargetExport *targetExport_local;
  cmExportInstallFileGenerator *this_local;
  
  local_1c = cmGeneratorTarget::GetType(targetExport->Target);
  if ((local_1c == OBJECT_LIBRARY) &&
     (targetExport->ObjectsGenerator == (cmInstallTargetGenerator *)0x0)) {
    local_1c = INTERFACE_LIBRARY;
  }
  return local_1c;
}

Assistant:

cmStateEnums::TargetType cmExportInstallFileGenerator::GetExportTargetType(
  cmTargetExport const* targetExport) const
{
  cmStateEnums::TargetType targetType = targetExport->Target->GetType();
  // An OBJECT library installed with no OBJECTS DESTINATION
  // is transformed to an INTERFACE library.
  if (targetType == cmStateEnums::OBJECT_LIBRARY &&
      targetExport->ObjectsGenerator == nullptr) {
    targetType = cmStateEnums::INTERFACE_LIBRARY;
  }
  return targetType;
}